

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdcSpfd.c
# Opt level: O0

int Bdc_SpfdHashValue(word t,int Size)

{
  uint local_28;
  uint local_24;
  uint Value;
  uint i;
  uchar *s;
  byte abStack_10 [4];
  int Size_local;
  word t_local;
  
  local_28 = 0;
  for (local_24 = 0; local_24 < 8; local_24 = local_24 + 1) {
    local_28 = Bdc_SpfdHashValue::BigPrimes[local_24] * (uint)abStack_10[local_24] ^ local_28;
  }
  return local_28 % (uint)Size;
}

Assistant:

int Bdc_SpfdHashValue( word t, int Size )
{
    // http://planetmath.org/encyclopedia/GoodHashTablePrimes.html
    // 53,
    // 97,
    // 193,
    // 389,
    // 769,
    // 1543,
    // 3079,
    // 6151,
    // 12289,
    // 24593,
    // 49157,
    // 98317,
    // 196613,
    // 393241,
    // 786433,
    // 1572869,
    // 3145739,
    // 6291469,
    // 12582917,
    // 25165843,
    // 50331653,
    // 100663319,
    // 201326611,
    // 402653189,
    // 805306457,
    // 1610612741,
    static unsigned BigPrimes[8] = {12582917, 25165843, 50331653, 100663319, 201326611, 402653189, 805306457, 1610612741};
    unsigned char * s = (unsigned char *)&t;
    unsigned i, Value = 0;
    for ( i = 0; i < 8; i++ )
        Value ^= BigPrimes[i] * s[i];
    return Value % Size;
}